

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

RepeatedPrimitiveDefaults *
google::protobuf::internal::RepeatedPrimitiveDefaults::default_instance(void)

{
  int iVar1;
  RepeatedPrimitiveDefaults *this;
  
  if (default_instance()::instance == '\0') {
    iVar1 = __cxa_guard_acquire(&default_instance()::instance);
    if (iVar1 != 0) {
      this = (RepeatedPrimitiveDefaults *)operator_new(0x70);
      RepeatedPrimitiveDefaults(this);
      default_instance::instance =
           OnShutdownDelete<google::protobuf::internal::RepeatedPrimitiveDefaults>(this);
      __cxa_guard_release(&default_instance()::instance);
    }
  }
  return default_instance::instance;
}

Assistant:

const RepeatedPrimitiveDefaults* RepeatedPrimitiveDefaults::default_instance() {
  static auto instance = OnShutdownDelete(new RepeatedPrimitiveDefaults);
  return instance;
}